

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans.h
# Opt level: O2

int __thiscall draco::RAnsEncoder<16>::write_end(RAnsEncoder<16> *this)

{
  uint uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  byte bVar5;
  long lVar6;
  
  uVar2 = (this->ans_).state;
  uVar1 = uVar2 - 0x40000;
  uVar4 = (uint8_t)uVar2;
  if (uVar1 < 0x40) {
    (this->ans_).buf[(this->ans_).buf_offset] = uVar4;
    return (this->ans_).buf_offset + 1;
  }
  bVar5 = (byte)(uVar2 >> 8);
  if (uVar1 < 0x4000) {
    puVar3 = (this->ans_).buf;
    lVar6 = (long)(this->ans_).buf_offset;
    puVar3[lVar6] = uVar4;
    puVar3[lVar6 + 1] = bVar5 | 0x40;
    return (this->ans_).buf_offset + 2;
  }
  if (uVar1 < 0x400000) {
    puVar3 = (this->ans_).buf;
    lVar6 = (long)(this->ans_).buf_offset;
    puVar3[lVar6] = uVar4;
    puVar3[lVar6 + 1] = bVar5;
    puVar3[lVar6 + 2] = (uint8_t)(uVar2 + 0x7c0000 >> 0x10);
    return (this->ans_).buf_offset + 3;
  }
  if (uVar1 < 0x40000000) {
    puVar3 = (this->ans_).buf;
    lVar6 = (long)(this->ans_).buf_offset;
    puVar3[lVar6] = uVar4;
    puVar3[lVar6 + 1] = bVar5;
    puVar3[lVar6 + 2] = (uint8_t)(uVar2 + 0xbffc0000 >> 0x10);
    puVar3[lVar6 + 3] = (uint8_t)(uVar2 + 0xbffc0000 >> 0x18);
    return (this->ans_).buf_offset + 4;
  }
  return (this->ans_).buf_offset;
}

Assistant:

inline int write_end() {
    uint32_t state;
    DRACO_DCHECK_GE(ans_.state, l_rans_base);
    DRACO_DCHECK_LT(ans_.state, l_rans_base * DRACO_ANS_IO_BASE);
    state = ans_.state - l_rans_base;
    if (state < (1 << 6)) {
      ans_.buf[ans_.buf_offset] = (0x00 << 6) + state;
      return ans_.buf_offset + 1;
    } else if (state < (1 << 14)) {
      mem_put_le16(ans_.buf + ans_.buf_offset, (0x01 << 14) + state);
      return ans_.buf_offset + 2;
    } else if (state < (1 << 22)) {
      mem_put_le24(ans_.buf + ans_.buf_offset, (0x02 << 22) + state);
      return ans_.buf_offset + 3;
    } else if (state < (1 << 30)) {
      mem_put_le32(ans_.buf + ans_.buf_offset, (0x03u << 30u) + state);
      return ans_.buf_offset + 4;
    } else {
      DRACO_DCHECK(0 && "State is too large to be serialized");
      return ans_.buf_offset;
    }
  }